

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_intrabc_info(AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r)

{
  int iVar1;
  int_interpfilters iVar2;
  uint uVar3;
  AV1_COMMON *in_RDX;
  MACROBLOCKD *in_RSI;
  bool bVar4;
  uint16_t (*unaff_retaddr) [8];
  int_mv (*in_stack_00000008) [2];
  int_mv *in_stack_00000010;
  int16_t *in_stack_00000018;
  int valid_dv;
  int_mv dv_ref;
  int_mv nearmv;
  int_mv nearestmv;
  int_mv ref_mvs [1] [2];
  int16_t inter_mode_ctx [29];
  BLOCK_SIZE bsize;
  FRAME_CONTEXT *ec_ctx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  aom_cdf_prob *in_stack_ffffffffffffff28;
  int_mv *near_mv;
  aom_reader *in_stack_ffffffffffffff30;
  int_mv *nearest_mv;
  int_mv *mvlist;
  undefined1 *puVar5;
  int_mv *in_stack_ffffffffffffff48;
  uint6 in_stack_ffffffffffffff50;
  bool bVar6;
  MACROBLOCKD *xd_00;
  ushort uVar7;
  ushort uVar8;
  undefined4 local_98;
  int local_94;
  undefined1 in_stack_ffffffffffffff70;
  aom_reader *in_stack_ffffffffffffff78;
  CANDIDATE_MV (*in_stack_ffffffffffffffb8) [8];
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar9;
  MV_REFERENCE_FRAME ref_frame;
  MACROBLOCKD *mi;
  
  xd_00 = (MACROBLOCKD *)*in_RSI->mi;
  ref_frame = (MV_REFERENCE_FRAME)((ulong)in_RSI->tile_ctx >> 0x38);
  iVar1 = aom_read_symbol_(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
  *(ushort *)((long)xd_00->plane[0].seg_dequant_QTX[5] + 3) =
       *(ushort *)((long)xd_00->plane[0].seg_dequant_QTX[5] + 3) & 0xff7f | ((byte)iVar1 & 1) << 7;
  if ((*(ushort *)((long)xd_00->plane[0].seg_dequant_QTX[5] + 3) >> 7 & 1) != 0) {
    uVar9 = CONCAT13((char)xd_00->mi_row,(int3)in_stack_ffffffffffffffc4);
    *(undefined1 *)((long)&xd_00->mi_row + 2) = 0;
    *(undefined1 *)((long)&xd_00->mi_row + 3) = 0;
    mi = xd_00;
    iVar2 = av1_broadcast_interp_filter(BILINEAR);
    xd_00->plane[0].subsampling_x = (int)iVar2;
    *(undefined1 *)&mi->plane[0].subsampling_y = 0;
    near_mv = (int_mv *)in_RSI->weight;
    nearest_mv = (int_mv *)&stack0xffffffffffffff70;
    puVar5 = &stack0xffffffffffffff78;
    mvlist = (int_mv *)0x0;
    av1_find_mv_refs(in_RDX,in_RSI,(MB_MODE_INFO *)mi,ref_frame,
                     (uint8_t *)CONCAT44(uVar9,iVar2.as_int),in_stack_ffffffffffffffb8,unaff_retaddr
                     ,in_stack_00000008,in_stack_00000010,in_stack_00000018);
    av1_find_best_ref_mvs((int)((ulong)puVar5 >> 0x20),mvlist,nearest_mv,near_mv,0);
    if (local_94 == 0) {
      uVar7 = (ushort)local_98;
      uVar8 = (ushort)((uint)local_98 >> 0x10);
    }
    else {
      uVar7 = (ushort)local_94;
      uVar8 = (ushort)((uint)local_94 >> 0x10);
    }
    if (CONCAT22(uVar8,uVar7) == 0) {
      av1_find_ref_dv(nearest_mv,(TileInfo *)&near_mv->as_mv,0,0x1c9551);
    }
    bVar6 = (uVar8 & 7) == 0 && (uVar7 & 7) == 0;
    uVar3 = (uint)bVar6;
    bVar4 = false;
    if (uVar3 != 0) {
      iVar1 = assign_dv((AV1_COMMON *)
                        CONCAT26((short)(((int)(short)uVar8 >> 3) << 3),
                                 CONCAT24((short)(((int)(short)uVar7 >> 3) << 3),uVar3)),xd_00,
                        (int_mv *)CONCAT17(bVar6,(uint7)in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48,(int)((ulong)puVar5 >> 0x20),(int)puVar5,
                        in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
      bVar4 = iVar1 != 0;
    }
    if (!bVar4) {
      aom_internal_error(in_RSI->error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid intrabc dv");
    }
  }
  return;
}

Assistant:

static void read_intrabc_info(AV1_COMMON *const cm, DecoderCodingBlock *dcb,
                              aom_reader *r) {
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  mbmi->use_intrabc = aom_read_symbol(r, ec_ctx->intrabc_cdf, 2, ACCT_STR);
  if (mbmi->use_intrabc) {
    BLOCK_SIZE bsize = mbmi->bsize;
    mbmi->mode = DC_PRED;
    mbmi->uv_mode = UV_DC_PRED;
    mbmi->interp_filters = av1_broadcast_interp_filter(BILINEAR);
    mbmi->motion_mode = SIMPLE_TRANSLATION;

    int16_t inter_mode_ctx[MODE_CTX_REF_FRAMES];
    int_mv ref_mvs[INTRA_FRAME + 1][MAX_MV_REF_CANDIDATES];

    av1_find_mv_refs(cm, xd, mbmi, INTRA_FRAME, dcb->ref_mv_count,
                     xd->ref_mv_stack, xd->weight, ref_mvs, /*global_mvs=*/NULL,
                     inter_mode_ctx);

    int_mv nearestmv, nearmv;

    av1_find_best_ref_mvs(0, ref_mvs[INTRA_FRAME], &nearestmv, &nearmv, 0);
    int_mv dv_ref = nearestmv.as_int == 0 ? nearmv : nearestmv;
    if (dv_ref.as_int == 0)
      av1_find_ref_dv(&dv_ref, &xd->tile, cm->seq_params->mib_size, xd->mi_row);
    // Ref DV should not have sub-pel.
    int valid_dv = (dv_ref.as_mv.col & 7) == 0 && (dv_ref.as_mv.row & 7) == 0;
    dv_ref.as_mv.col = (dv_ref.as_mv.col >> 3) * 8;
    dv_ref.as_mv.row = (dv_ref.as_mv.row >> 3) * 8;
    valid_dv = valid_dv && assign_dv(cm, xd, &mbmi->mv[0], &dv_ref, xd->mi_row,
                                     xd->mi_col, bsize, r);
    if (!valid_dv) {
      // Intra bc motion vectors are not valid - signal corrupt frame
      aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                         "Invalid intrabc dv");
    }
  }
}